

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::printTo(ColumnCryptoMetaData *this,ostream *out)

{
  ostream *poVar1;
  string sStack_38;
  
  std::operator<<((ostream *)out,"ColumnCryptoMetaData(");
  std::operator<<((ostream *)out,"ENCRYPTION_WITH_FOOTER_KEY=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<((ostream *)out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionWithFooterKey>
              (&sStack_38,&this->ENCRYPTION_WITH_FOOTER_KEY);
    std::operator<<((ostream *)out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<((ostream *)out,", ");
  std::operator<<(poVar1,"ENCRYPTION_WITH_COLUMN_KEY=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<((ostream *)out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionWithColumnKey>
              (&sStack_38,&this->ENCRYPTION_WITH_COLUMN_KEY);
    std::operator<<((ostream *)out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<((ostream *)out,")");
  return;
}

Assistant:

void ColumnCryptoMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnCryptoMetaData(";
  out << "ENCRYPTION_WITH_FOOTER_KEY="; (__isset.ENCRYPTION_WITH_FOOTER_KEY ? (out << to_string(ENCRYPTION_WITH_FOOTER_KEY)) : (out << "<null>"));
  out << ", " << "ENCRYPTION_WITH_COLUMN_KEY="; (__isset.ENCRYPTION_WITH_COLUMN_KEY ? (out << to_string(ENCRYPTION_WITH_COLUMN_KEY)) : (out << "<null>"));
  out << ")";
}